

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getB10G11R11
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<float,_4U> *this)

{
  uint uVar1;
  pointer puVar2;
  uint32 uVar3;
  Color *pCVar4;
  uint32_t y;
  uint y_00;
  uint32_t x;
  uint x_00;
  allocator_type local_41;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_40;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)((this->super_Image).height * (this->super_Image).width * 4),&local_41);
  for (y_00 = 0; y_00 < (this->super_Image).height; y_00 = y_00 + 1) {
    for (x_00 = 0; uVar1 = (this->super_Image).width, x_00 < uVar1; x_00 = x_00 + 1) {
      puVar2 = (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pCVar4 = operator()(this,x_00,y_00);
      local_40.field_0.z = (pCVar4->field_0).comps[2];
      local_40._0_8_ = *(undefined8 *)&pCVar4->field_0;
      uVar3 = glm::packF2x11_1x10((vec3 *)&local_40.field_0);
      *(uint32 *)(puVar2 + (uVar1 * y_00 + x_00) * 4) = uVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<uint8_t> getB10G11R11() const override {
        assert(3 <= componentCount);
        assert(std::is_floating_point_v<componentType>);

        std::vector<uint8_t> data(height * width * 4);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                auto* target = data.data() + (y * width + x) * 4;

                const auto pixel = (*this)(x, y);
                const auto r = pixel[0];
                const auto g = pixel[1];
                const auto b = pixel[2];
                const auto outValue = glm::packF2x11_1x10(glm::vec3(r, g, b));
                std::memcpy(target, &outValue, sizeof(outValue));
            }
        }

        return data;
    }